

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_flattener.h
# Opt level: O0

EExpr * __thiscall
mp::
ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,mp::BasicProblem<mp::BasicProblemParams<int>>,mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>>,mp::BasicProblem<mp::BasicProblemParams<int>>,mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>>
::
VisitRelationalExpression<0,std::initializer_list<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)71>>>
          (ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
           *this,initializer_list<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_> ea)

{
  bool bVar1;
  QuadAndLinTerms *le;
  QuadAndLinTerms *pQVar2;
  EExpr *in_RDI;
  double dVar3;
  value_type *lhs;
  array<mp::EExpr,_2UL> ee;
  AlgebraicExpression<mp::QuadAndLinTerms> *in_stack_fffffffffffff288;
  AlgebraicExpression<mp::QuadAndLinTerms> *in_stack_fffffffffffff290;
  AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_> *this_00;
  AlgebraicExpression<mp::QuadAndLinTerms> *in_stack_fffffffffffff298;
  AlgebraicExpression<mp::QuadAndLinTerms> *in_stack_fffffffffffff2a0;
  undefined1 fSort;
  ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  *this_01;
  AlgConRhs<0> rr;
  AlgConRhs<0> local_d20 [9];
  Arguments *in_stack_fffffffffffff328;
  ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>_>
  *in_stack_fffffffffffff330;
  array<mp::EExpr,_2UL> *in_stack_fffffffffffff460;
  Arguments *in_stack_fffffffffffff468;
  ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  *in_stack_fffffffffffff470;
  AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_> local_980;
  undefined4 local_76c;
  AlgConRhs<0> local_768 [36];
  undefined1 local_648 [680];
  undefined1 local_3a0 [928];
  
  rr.rhs_ = (double)in_RDI;
  std::array<mp::EExpr,_2UL>::array((array<mp::EExpr,_2UL> *)in_stack_fffffffffffff2a0);
  Exprs2EExprs<std::initializer_list<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)71>>,2ul>
            (in_stack_fffffffffffff470,
             (initializer_list<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_> *)
             in_stack_fffffffffffff468,in_stack_fffffffffffff460);
  fSort = (undefined1)((ulong)local_3a0 >> 0x38);
  le = (QuadAndLinTerms *)
       std::array<mp::EExpr,_2UL>::operator[]
                 ((array<mp::EExpr,_2UL> *)in_stack_fffffffffffff290,
                  (size_type)in_stack_fffffffffffff288);
  std::array<mp::EExpr,_2UL>::operator[]
            ((array<mp::EExpr,_2UL> *)in_stack_fffffffffffff290,(size_type)in_stack_fffffffffffff288
            );
  this_01 = (ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
             *)(local_648 + 0xd8);
  AlgebraicExpression<mp::QuadAndLinTerms>::AlgebraicExpression
            (in_stack_fffffffffffff290,in_stack_fffffffffffff288);
  AlgebraicExpression<mp::QuadAndLinTerms>::subtract
            (in_stack_fffffffffffff2a0,in_stack_fffffffffffff298);
  AlgebraicExpression<mp::QuadAndLinTerms>::~AlgebraicExpression
            ((AlgebraicExpression<mp::QuadAndLinTerms> *)0x434049);
  local_648._208_8_ =
       std::array<mp::EExpr,_2UL>::operator[]
                 ((array<mp::EExpr,_2UL> *)in_stack_fffffffffffff290,
                  (size_type)in_stack_fffffffffffff288);
  QuadAndLinTerms::sort_terms(&in_stack_fffffffffffff290->super_QuadAndLinTerms);
  bVar1 = AlgebraicExpression<mp::QuadAndLinTerms>::is_affine
                    ((AlgebraicExpression<mp::QuadAndLinTerms> *)0x43407e);
  if (bVar1) {
    QuadAndLinTerms::GetLinTerms((QuadAndLinTerms *)local_648._208_8_);
    LinTerms::LinTerms((LinTerms *)in_stack_fffffffffffff290,(LinTerms *)in_stack_fffffffffffff288);
    dVar3 = AlgebraicExpression<mp::QuadAndLinTerms>::constant_term
                      ((AlgebraicExpression<mp::QuadAndLinTerms> *)local_648._208_8_);
    AlgConRhs<0>::AlgConRhs(local_768,-dVar3);
    AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>::AlgebraicConstraint
              ((AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_> *)this_01,&le->super_LinTerms,
               rr,(bool)fSort);
    in_stack_fffffffffffff2a0 = (AlgebraicExpression<mp::QuadAndLinTerms> *)local_648;
    ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>_>::
    ConditionalConstraint(in_stack_fffffffffffff330,in_stack_fffffffffffff328);
    AssignResult2Args<mp::ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,mp::AlgConRhs<0>>>>
              (this_01,(ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>_>
                        *)le);
    ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>_>::
    ~ConditionalConstraint
              ((ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>_> *)
               0x43412d);
    AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>::~AlgebraicConstraint
              ((AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_> *)in_stack_fffffffffffff290);
    LinTerms::~LinTerms((LinTerms *)in_stack_fffffffffffff290);
  }
  else {
    pQVar2 = AlgebraicExpression<mp::QuadAndLinTerms>::GetAlgConBody
                       ((AlgebraicExpression<mp::QuadAndLinTerms> *)0x4341f9);
    QuadAndLinTerms::QuadAndLinTerms(&in_stack_fffffffffffff2a0->super_QuadAndLinTerms,pQVar2);
    dVar3 = AlgebraicExpression<mp::QuadAndLinTerms>::constant_term
                      ((AlgebraicExpression<mp::QuadAndLinTerms> *)local_648._208_8_);
    AlgConRhs<0>::AlgConRhs(local_d20,-dVar3);
    AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_>::AlgebraicConstraint
              ((AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_> *)this_01,le,rr,
               (bool)fSort);
    this_00 = &local_980;
    ConditionalConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_>_>::
    ConditionalConstraint
              ((ConditionalConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_>_>
                *)in_stack_fffffffffffff470,in_stack_fffffffffffff468);
    AssignResult2Args<mp::ConditionalConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRhs<0>>>>
              (this_01,(ConditionalConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_>_>
                        *)le);
    ConditionalConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_>_>::
    ~ConditionalConstraint
              ((ConditionalConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_>_>
                *)0x434291);
    AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_>::~AlgebraicConstraint(this_00);
    QuadAndLinTerms::~QuadAndLinTerms((QuadAndLinTerms *)this_00);
  }
  local_76c = 1;
  std::array<mp::EExpr,_2UL>::~array((array<mp::EExpr,_2UL> *)in_stack_fffffffffffff2a0);
  return in_RDI;
}

Assistant:

EExpr VisitRelationalExpression(ExprArray ea) {
    std::array<EExpr, 2> ee;
    Exprs2EExprs(ea, ee);
    ee[0].subtract(std::move(ee[1]));
    auto& lhs = ee[0];
    lhs.sort_terms();                             // to catch duplicates
    if (lhs.is_affine())                          // no QP terms
      return AssignResult2Args(                   // add conditional linear constraint
            ConditionalConstraint< LinConRhs<comp_kind> >
            { { std::move(lhs.GetLinTerms()),
                -lhs.constant_term() } } );
    return AssignResult2Args(                     // add conditional quadratic constraint
            ConditionalConstraint< QuadConRhs<comp_kind> >
            { { std::move(lhs.GetAlgConBody()),
                -lhs.constant_term() } } );
  }